

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O3

void __thiscall
Rml::ElementDocument::ProcessHeader(ElementDocument *this,DocumentHeader *document_header)

{
  byte *_buffer;
  size_t _buffer_size;
  Vector2f vp_dimensions;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  String *name;
  Template *this_00;
  DocumentHeader *header_00;
  StreamMemory *this_01;
  StyleSheetContainer *container;
  Vector2i VVar4;
  Resource *script;
  pointer pRVar5;
  ulong uVar6;
  pointer pRVar7;
  _Head_base<0UL,_Rml::StyleSheet_*,_false> this_02;
  long lVar8;
  ElementDocument *this_03;
  float dp_ratio;
  float fVar9;
  float fVar10;
  SharedPtr<Rml::StyleSheetContainer> inline_sheet;
  UniquePtr<Rml::StreamMemory> stream;
  DocumentHeader header;
  pointer local_230;
  undefined1 local_228 [24];
  pointer local_210;
  ElementDocument *local_208;
  SharedPtr<StyleSheetContainer> local_200;
  undefined1 local_1f0 [64];
  StringList local_1b0;
  vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_> vStack_198;
  vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_> local_180;
  URL local_168;
  
  ::std::__cxx11::string::_M_assign((string *)&this->source_url);
  local_1f0._0_8_ = local_1f0 + 0x10;
  local_1f0._8_8_ = (pointer)0x0;
  local_1f0[0x10] = '\0';
  local_1f0._32_8_ = local_1f0 + 0x30;
  local_1f0._40_8_ = 0;
  local_1f0[0x30] = '\0';
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_198.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_198.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_198.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_180.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_180.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DocumentHeader::MergePaths
            ((DocumentHeader *)local_1f0,&local_1b0,&document_header->template_resources,
             &document_header->source);
  local_208 = this;
  if (local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      URL::URL(&local_168,
               (String *)
               ((long)&((local_1b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8));
      name = URL::GetURL_abi_cxx11_(&local_168);
      this_00 = TemplateCache::LoadTemplate(name);
      URL::~URL(&local_168);
      if (this_00 == (Template *)0x0) {
        Log::Message(LT_WARNING,"Template %s not found",
                     *(undefined8 *)
                      ((long)&((local_1b0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar8));
      }
      else {
        header_00 = Template::GetHeader(this_00);
        DocumentHeader::MergeHeader((DocumentHeader *)local_1f0,header_00);
      }
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar6 < (ulong)((long)local_1b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  DocumentHeader::MergeHeader((DocumentHeader *)local_1f0,document_header);
  this_03 = local_208;
  ::std::__cxx11::string::_M_assign((string *)&local_208->title);
  local_210 = vStack_198.
              super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (vStack_198.
      super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      vStack_198.
      super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00225c78:
    local_230 = (pointer)0x0;
    pRVar5 = local_180.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar7 = local_180.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    this_02._M_head_impl = (StyleSheet *)0x0;
    local_230 = (pointer)0x0;
    pRVar7 = vStack_198.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pRVar7->is_inline == true) {
        local_228._0_8_ = (StyleSheet *)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Rml::StyleSheetContainer,std::allocator<Rml::StyleSheetContainer>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8),
                   (StyleSheetContainer **)local_228,
                   (allocator<Rml::StyleSheetContainer> *)&local_168);
        _buffer = (byte *)(pRVar7->content)._M_dataplus._M_p;
        _buffer_size = (pRVar7->content)._M_string_length;
        this_01 = (StreamMemory *)operator_new(0x170);
        StreamMemory::StreamMemory(this_01,_buffer,_buffer_size);
        local_228._16_8_ = this_01;
        URL::URL(&local_168,&pRVar7->path);
        StreamMemory::SetSourceURL(this_01,&local_168);
        URL::~URL(&local_168);
        bVar3 = StyleSheetContainer::LoadStyleSheetContainer
                          ((StyleSheetContainer *)local_228._0_8_,(Stream *)local_228._16_8_,
                           pRVar7->line);
        uVar2 = local_228._8_8_;
        uVar1 = local_228._0_8_;
        if (bVar3) {
          if (this_02._M_head_impl == (StyleSheet *)0x0) {
            local_228._0_8_ = (StyleSheet *)0x0;
            local_228._8_8_ = (pointer)0x0;
            if (local_230 != (pointer)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230);
            }
            local_230 = (pointer)uVar2;
            this_02._M_head_impl = (StyleSheet *)uVar1;
          }
          else {
            StyleSheetContainer::MergeStyleSheetContainer
                      ((StyleSheetContainer *)this_02._M_head_impl,
                       (StyleSheetContainer *)local_228._0_8_);
          }
        }
        uVar1 = local_228._16_8_;
        local_228._16_8_ = (pointer)0x0;
        if ((StreamMemory *)uVar1 != (StreamMemory *)0x0) {
          StreamMemory::~StreamMemory((StreamMemory *)uVar1);
          operator_delete((void *)uVar1,0x170);
        }
        ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::~unique_ptr
                  ((unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> *)
                   (local_228 + 0x10));
        if ((pointer)local_228._8_8_ != (pointer)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
        }
      }
      else {
        container = StyleSheetFactory::GetStyleSheetContainer(&pRVar7->path);
        if (container == (StyleSheetContainer *)0x0) {
          Log::Message(LT_ERROR,"Failed to load style sheet %s.",(pRVar7->path)._M_dataplus._M_p);
        }
        else if (this_02._M_head_impl == (StyleSheet *)0x0) {
          StyleSheetContainer::StyleSheetContainer((StyleSheetContainer *)&local_168);
          StyleSheetContainer::CombineStyleSheetContainer
                    ((StyleSheetContainer *)local_228,container);
          uVar1 = local_228._8_8_;
          this_02._M_head_impl = (StyleSheet *)local_228._0_8_;
          local_228._0_8_ = (StyleSheet *)0x0;
          local_228._8_8_ = (pointer)0x0;
          if ((local_230 != (pointer)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230),
             (pointer)local_228._8_8_ != (pointer)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
          }
          StyleSheetContainer::~StyleSheetContainer((StyleSheetContainer *)&local_168);
          local_230 = (pointer)uVar1;
        }
        else {
          StyleSheetContainer::MergeStyleSheetContainer
                    ((StyleSheetContainer *)this_02._M_head_impl,container);
        }
      }
      this_03 = local_208;
      pRVar7 = pRVar7 + 1;
    } while (pRVar7 != local_210);
    pRVar5 = local_180.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar7 = local_180.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_02._M_head_impl != (StyleSheet *)0x0) {
      local_200.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230;
      local_200.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this_02._M_head_impl;
      SetStyleSheetContainer(local_208,&local_200);
      if ((pointer)local_200.
                   super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi != (pointer)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.
                   super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      goto LAB_00225c78;
    }
  }
  for (; pRVar5 != pRVar7; pRVar5 = pRVar5 + 1) {
    if (pRVar5->is_inline == true) {
      (*(this_03->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable[0x18])
                (this_03,&pRVar5->content,pRVar5,(ulong)(uint)pRVar5->line);
    }
    else {
      (*(this_03->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable[0x19])
                (this_03,pRVar5);
    }
  }
  local_168.url._M_dataplus._M_p = (pointer)0x2d;
  Variant::Set((Variant *)&local_168,1);
  local_168.protocol._M_string_length = 0xffffffff00000001;
  local_168.protocol.field_2._M_allocated_capacity = 0;
  local_168.protocol.field_2._8_4_ = 0xffffffff;
  local_168.login._M_dataplus._M_p = (pointer)0x0;
  local_168.login._M_string_length = 0;
  Element::SetProperty(&this_03->super_Element,Visibility,(Property *)&local_168);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.login._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.login._M_string_length);
  }
  Variant::~Variant((Variant *)&local_168);
  if (this_03->context == (Context *)0x0) {
    dp_ratio = 1.0;
  }
  else {
    dp_ratio = Context::GetDensityIndependentPixelRatio(this_03->context);
    local_210 = (pointer)CONCAT44(local_210._4_4_,dp_ratio);
    if (this_03->context != (Context *)0x0) {
      VVar4 = Context::GetDimensions(this_03->context);
      fVar10 = (float)VVar4.x;
      fVar9 = (float)VVar4.y;
      dp_ratio = local_210._0_4_;
      goto LAB_00225d9c;
    }
  }
  fVar10 = 1.0;
  fVar9 = 1.0;
LAB_00225d9c:
  vp_dimensions.y = fVar9;
  vp_dimensions.x = fVar10;
  Element::UpdateProperties(&this_03->super_Element,dp_ratio,vp_dimensions);
  if (local_230 != (pointer)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230);
  }
  ::std::vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>::
  ~vector(&local_180);
  ::std::vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>::
  ~vector(&vStack_198);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b0);
  if ((undefined1 *)local_1f0._32_8_ != local_1f0 + 0x30) {
    operator_delete((void *)local_1f0._32_8_,CONCAT71(local_1f0._49_7_,local_1f0[0x30]) + 1);
  }
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,CONCAT71(local_1f0._17_7_,local_1f0[0x10]) + 1);
  }
  return;
}

Assistant:

void ElementDocument::ProcessHeader(const DocumentHeader* document_header)
{
	RMLUI_ZoneScoped;

	// Store the source address that we came from
	source_url = document_header->source;

	// Construct a new header and copy the template details across
	DocumentHeader header;
	header.MergePaths(header.template_resources, document_header->template_resources, document_header->source);

	// Merge in any templates, note a merge may cause more templates to merge
	for (size_t i = 0; i < header.template_resources.size(); i++)
	{
		Template* merge_template = TemplateCache::LoadTemplate(URL(header.template_resources[i]).GetURL());

		if (merge_template)
			header.MergeHeader(*merge_template->GetHeader());
		else
			Log::Message(Log::LT_WARNING, "Template %s not found", header.template_resources[i].c_str());
	}

	// Merge the document's header last, as it is the most overriding.
	header.MergeHeader(*document_header);

	// Set the title to the document title.
	title = document_header->title;

	// If a style-sheet (or sheets) has been specified for this element, then we load them and set the combined sheet
	// on the element; all of its children will inherit it by default.
	SharedPtr<StyleSheetContainer> new_style_sheet;

	// Combine any inline sheets.
	for (const DocumentHeader::Resource& rcss : header.rcss)
	{
		if (rcss.is_inline)
		{
			auto inline_sheet = MakeShared<StyleSheetContainer>();
			auto stream = MakeUnique<StreamMemory>((const byte*)rcss.content.c_str(), rcss.content.size());
			stream->SetSourceURL(rcss.path);

			if (inline_sheet->LoadStyleSheetContainer(stream.get(), rcss.line))
			{
				if (new_style_sheet)
					new_style_sheet->MergeStyleSheetContainer(*inline_sheet);
				else
					new_style_sheet = std::move(inline_sheet);
			}

			stream.reset();
		}
		else
		{
			const StyleSheetContainer* sub_sheet = StyleSheetFactory::GetStyleSheetContainer(rcss.path);
			if (sub_sheet)
			{
				if (new_style_sheet)
					new_style_sheet->MergeStyleSheetContainer(*sub_sheet);
				else
					new_style_sheet = sub_sheet->CombineStyleSheetContainer(StyleSheetContainer());
			}
			else
				Log::Message(Log::LT_ERROR, "Failed to load style sheet %s.", rcss.path.c_str());
		}
	}

	// If a style sheet is available, set it on the document.
	if (new_style_sheet)
		SetStyleSheetContainer(std::move(new_style_sheet));

	// Load scripts.
	for (const DocumentHeader::Resource& script : header.scripts)
	{
		if (script.is_inline)
		{
			LoadInlineScript(script.content, script.path, script.line);
		}
		else
		{
			LoadExternalScript(script.path);
		}
	}

	// Hide this document.
	SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));

	const float dp_ratio = (context ? context->GetDensityIndependentPixelRatio() : 1.0f);
	const Vector2f vp_dimensions = (context ? Vector2f(context->GetDimensions()) : Vector2f(1.0f));

	// Update properties so that e.g. visibility status can be queried properly immediately.
	UpdateProperties(dp_ratio, vp_dimensions);
}